

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
          (Exception *this,char **args,char *args_1,int *args_2,char (*args_3) [13],char **args_4,
          char *args_5,char **args_6,char (*args_7) [7],char **args_8)

{
  string *in_RDI;
  ostringstream oss;
  ostringstream *this_00;
  char *in_stack_fffffffffffffe10;
  char **in_stack_fffffffffffffe18;
  ostringstream *in_stack_fffffffffffffe20;
  Exception *in_stack_fffffffffffffe28;
  char **in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char **in_stack_fffffffffffffe50;
  char (*in_stack_fffffffffffffe58) [7];
  char **in_stack_fffffffffffffe60;
  
  this_00 = (ostringstream *)&stack0xfffffffffffffe40;
  std::__cxx11::ostringstream::ostringstream(this_00);
  SetWhat<char_const*&,char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10,(int *)this_00,(char (*) [13])in_RDI,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(in_RDI,(string *)&stack0xfffffffffffffe10);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe40);
  return;
}

Assistant:

void SetWhat(Args&&... args)
        {
            std::ostringstream oss;
            SetWhat(oss, std::forward<Args>(args)...);
            what_ = oss.str();
        }